

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::Reflect<2>::doExpand
          (Reflect<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  SharedPtrStateBase *arg0;
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  float local_11c;
  ExprP<float> local_118;
  ExprP<float> local_108;
  ExprP<tcu::Vector<float,_2>_> local_f8;
  float local_e4;
  ExprP<float> local_e0;
  ExprP<tcu::Vector<float,_2>_> local_d0;
  ExprP<tcu::Vector<float,_2>_> local_c0;
  ExprP<tcu::Vector<float,_2>_> local_b0;
  ExprP<float> local_a0 [2];
  allocator<char> local_79;
  string local_78;
  VariableP<float> local_58;
  undefined1 local_48 [8];
  ExprP<float> dotNI;
  ExprP<tcu::Vector<float,_2>_> *n;
  ExprP<tcu::Vector<float,_2>_> *i;
  ArgExprs *args_local;
  ExpandContext *ctx_local;
  Reflect<2> *this_local;
  
  dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       (SharedPtrStateBase *)(in_RCX + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"dotNI",&local_79);
  dot<2>((Functions *)local_a0,
         (ExprP<tcu::Vector<float,_2>_> *)
         dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
         m_state,in_RCX);
  bindExpression<float>((shaderexecutor *)&local_58,&local_78,(ExpandContext *)args,local_a0);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)local_48);
  VariableP<float>::~VariableP(&local_58);
  ExprP<float>::~ExprP(local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_d0,
             (ExprP<tcu::Vector<float,_2>_> *)
             dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
             m_state,(ExprP<float> *)local_48);
  local_e4 = 2.0;
  constant<float>((shaderexecutor *)&local_e0,&local_e4);
  shaderexecutor::operator*((shaderexecutor *)&local_c0,&local_d0,&local_e0);
  arg0 = dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
         m_state;
  local_11c = 2.0;
  constant<float>((shaderexecutor *)&local_118,&local_11c);
  shaderexecutor::operator*((shaderexecutor *)&local_108,(ExprP<float> *)local_48,&local_118);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_f8,(ExprP<tcu::Vector<float,_2>_> *)arg0,&local_108);
  alternatives<tcu::Vector<float,2>>((shaderexecutor *)&local_b0,&local_c0,&local_f8);
  shaderexecutor::operator-((shaderexecutor *)this,in_RCX,&local_b0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_b0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_f8);
  ExprP<float>::~ExprP(&local_108);
  ExprP<float>::~ExprP(&local_118);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_c0);
  ExprP<float>::~ExprP(&local_e0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_d0);
  ExprP<float>::~ExprP((ExprP<float> *)local_48);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext& ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));

		return i - alternatives((n * dotNI) * constant(2.0f),
								n * (dotNI * constant(2.0f)));
	}